

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contacts.cpp
# Opt level: O2

void __thiscall IContactList::RemoveContact(IContactList *this,char *pName,char *pClan)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  ulong uVar5;
  
  uVar1 = str_quickhash(pName);
  uVar2 = str_quickhash(pClan);
  uVar5 = 0;
  uVar3 = (ulong)(uint)this->m_NumContacts;
  if (this->m_NumContacts < 1) {
    uVar3 = uVar5;
  }
  puVar4 = &this->m_aContacts[0].m_ClanHash;
  while( true ) {
    if (uVar3 == uVar5) {
      return;
    }
    if ((puVar4[-1] == uVar1) && (*puVar4 == uVar2)) break;
    uVar5 = uVar5 + 1;
    puVar4 = puVar4 + 0x1f;
  }
  RemoveContact(this,(int)uVar5);
  return;
}

Assistant:

void IContactList::RemoveContact(const char *pName, const char *pClan)
{
	unsigned NameHash = str_quickhash(pName);
	unsigned ClanHash = str_quickhash(pClan);
	for(int i = 0; i < m_NumContacts; ++i)
	{
		if(m_aContacts[i].m_NameHash == NameHash && m_aContacts[i].m_ClanHash == ClanHash)
		{
			RemoveContact(i);
			return;
		}
	}
}